

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_compact.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  ostream *this_00;
  TestRunStats *_testRunStats_local;
  CompactReporter *this_local;
  
  printTotals(this,&_testRunStats->totals);
  this_00 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,_testRunStats);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& _testRunStats ) {
            printTotals( _testRunStats.totals );
            stream << "\n" << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }